

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gl4cShaderSubroutineTests.cpp
# Opt level: O0

bool __thiscall
gl4cts::ShaderSubroutine::FunctionalTest3_4::testDraw
          (FunctionalTest3_4 *this,GLuint program_id,GLchar *first_routine_name,
          GLchar *second_routine_name,GLchar **uniform_names,vec4<float> *expected_results,
          bool use_program_query)

{
  undefined1 *__return_storage_ptr__;
  int iVar1;
  GLint GVar2;
  GLint GVar3;
  GLuint GVar4;
  GLuint GVar5;
  deUint32 dVar6;
  RenderContext *pRVar7;
  undefined4 extraout_var;
  TestError *this_00;
  float *pfVar8;
  TestContext *pTVar9;
  TestLog *pTVar10;
  MessageBuilder *pMVar11;
  double extraout_XMM0_Qa;
  double dVar12;
  double extraout_XMM0_Qa_00;
  bool local_599;
  vec4<float> *local_588;
  uint local_56c;
  undefined1 local_568 [4];
  GLuint i_2;
  uint local_3e4;
  undefined1 local_3e0 [4];
  GLuint i_1;
  MessageBuilder message;
  uint local_dc;
  undefined1 local_d8 [4];
  GLuint i;
  vec4<float> results [5];
  GLfloat *feedback_data;
  GLint input_data_location;
  GLuint second_routine_index;
  GLuint first_routine_index;
  GLint second_routine_location;
  GLint first_routine_location;
  GLuint subroutine_uniforms [2];
  bool result;
  Functions *gl;
  bool use_program_query_local;
  vec4<float> *expected_results_local;
  GLchar **uniform_names_local;
  GLchar *second_routine_name_local;
  GLchar *first_routine_name_local;
  FunctionalTest3_4 *pFStack_10;
  GLuint program_id_local;
  FunctionalTest3_4 *this_local;
  
  uniform_names_local = (GLchar **)second_routine_name;
  second_routine_name_local = first_routine_name;
  first_routine_name_local._4_4_ = program_id;
  pFStack_10 = this;
  pRVar7 = deqp::Context::getRenderContext((this->super_TestCase).m_context);
  iVar1 = (*pRVar7->_vptr_RenderContext[3])();
  register0x00000000 = CONCAT44(extraout_var,iVar1);
  subroutine_uniforms[0]._3_1_ = 1;
  memset(&second_routine_location,0,8);
  GVar2 = getSubroutineUniformLocation
                    (this,first_routine_name_local._4_4_,*uniform_names,use_program_query);
  GVar3 = getSubroutineUniformLocation
                    (this,first_routine_name_local._4_4_,uniform_names[1],use_program_query);
  GVar4 = getSubroutineIndex(this,first_routine_name_local._4_4_,second_routine_name_local,
                             use_program_query);
  GVar5 = getSubroutineIndex(this,first_routine_name_local._4_4_,(GLchar *)uniform_names_local,
                             use_program_query);
  (&second_routine_location)[GVar2] = GVar4;
  (&second_routine_location)[GVar3] = GVar5;
  (**(code **)(stack0xffffffffffffffb8 + 0x1668))(0x8b31,2,&second_routine_location);
  dVar6 = (**(code **)(stack0xffffffffffffffb8 + 0x800))();
  glu::checkError(dVar6,"UniformSubroutinesuiv",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/gl/gl4cShaderSubroutineTests.cpp"
                  ,0xe7a);
  iVar1 = (**(code **)(stack0xffffffffffffffb8 + 0xb48))
                    (first_routine_name_local._4_4_,"input_data");
  dVar6 = (**(code **)(stack0xffffffffffffffb8 + 0x800))();
  glu::checkError(dVar6,"GetUniformLocation",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/gl/gl4cShaderSubroutineTests.cpp"
                  ,0xe7e);
  if (iVar1 == -1) {
    this_00 = (TestError *)__cxa_allocate_exception(0x38);
    tcu::TestError::TestError
              (this_00,"Uniform is not available",(char *)0x0,
               "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/gl/gl4cShaderSubroutineTests.cpp"
               ,0xe82);
    __cxa_throw(this_00,&tcu::TestError::typeinfo,tcu::TestError::~TestError);
  }
  (**(code **)(stack0xffffffffffffffb8 + 0x15a0))
            (expected_results->m_x,expected_results->m_y,expected_results->m_z,expected_results->m_w
             ,iVar1);
  dVar6 = (**(code **)(stack0xffffffffffffffb8 + 0x800))();
  glu::checkError(dVar6,"Uniform4f",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/gl/gl4cShaderSubroutineTests.cpp"
                  ,0xe88);
  (**(code **)(stack0xffffffffffffffb8 + 0x30))(0);
  dVar6 = (**(code **)(stack0xffffffffffffffb8 + 0x800))();
  glu::checkError(dVar6,"BeginTransformFeedback",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/gl/gl4cShaderSubroutineTests.cpp"
                  ,0xe8c);
  (**(code **)(stack0xffffffffffffffb8 + 0x538))(0,0,1);
  dVar6 = (**(code **)(stack0xffffffffffffffb8 + 0x800))();
  glu::checkError(dVar6,"DrawArrays",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/gl/gl4cShaderSubroutineTests.cpp"
                  ,0xe8f);
  (**(code **)(stack0xffffffffffffffb8 + 0x638))();
  dVar6 = (**(code **)(stack0xffffffffffffffb8 + 0x800))();
  glu::checkError(dVar6,"EndTransformFeedback",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/gl/gl4cShaderSubroutineTests.cpp"
                  ,0xe92);
  pfVar8 = (float *)(**(code **)(stack0xffffffffffffffb8 + 0xcf8))(0x8c8e,35000);
  dVar6 = (**(code **)(stack0xffffffffffffffb8 + 0x800))();
  glu::checkError(dVar6,"MapBuffer",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/gl/gl4cShaderSubroutineTests.cpp"
                  ,0xe96);
  local_588 = (vec4<float> *)local_d8;
  do {
    Utils::vec4<float>::vec4(local_588);
    local_588 = local_588 + 1;
  } while (local_588 != (vec4<float> *)&results[4].m_z);
  local_d8 = (undefined1  [4])*pfVar8;
  i = (GLuint)pfVar8[1];
  results[0].m_x = pfVar8[2];
  results[0].m_y = pfVar8[3];
  results[0].m_z = pfVar8[4];
  results[0].m_w = pfVar8[5];
  results[1].m_x = pfVar8[6];
  results[1].m_y = pfVar8[7];
  results[1].m_z = pfVar8[8];
  results[1].m_w = pfVar8[9];
  results[2].m_x = pfVar8[10];
  results[2].m_y = pfVar8[0xb];
  results[2].m_z = pfVar8[0xc];
  results[2].m_w = pfVar8[0xd];
  results[3].m_x = pfVar8[0xe];
  results[3].m_y = pfVar8[0xf];
  results[3].m_z = pfVar8[0x10];
  results[3].m_w = pfVar8[0x11];
  results[4].m_x = pfVar8[0x12];
  results[4].m_y = pfVar8[0x13];
  (**(code **)(stack0xffffffffffffffb8 + 0x1670))(0x8c8e);
  dVar6 = (**(code **)(stack0xffffffffffffffb8 + 0x800))();
  glu::checkError(dVar6,"UnmapBuffer",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/gl/gl4cShaderSubroutineTests.cpp"
                  ,0xeb4);
  for (local_dc = 0; local_dc < 5; local_dc = local_dc + 1) {
    local_599 = false;
    if ((subroutine_uniforms[0]._3_1_ & 1) != 0) {
      local_599 = Utils::vec4<float>::operator==
                            ((vec4<float> *)(local_d8 + (ulong)local_dc * 0x10),
                             expected_results + local_dc);
    }
    subroutine_uniforms[0]._3_1_ = local_599;
  }
  if ((subroutine_uniforms[0]._3_1_ & 1) == 0) {
    pTVar9 = deqp::Context::getTestContext((this->super_TestCase).m_context);
    pTVar10 = tcu::TestContext::getLog(pTVar9);
    __return_storage_ptr__ = &message.m_str.field_0x170;
    tcu::TestLog::operator<<
              ((MessageBuilder *)__return_storage_ptr__,pTVar10,
               (BeginMessageToken *)&tcu::TestLog::Message);
    pMVar11 = tcu::MessageBuilder::operator<<
                        ((MessageBuilder *)__return_storage_ptr__,
                         (char (*) [39])"Error. Invalid result. First routine: ");
    pMVar11 = tcu::MessageBuilder::operator<<(pMVar11,&second_routine_name_local);
    pMVar11 = tcu::MessageBuilder::operator<<(pMVar11,(char (*) [19])". Second routine: ");
    pMVar11 = tcu::MessageBuilder::operator<<(pMVar11,(char **)&uniform_names_local);
    tcu::MessageBuilder::operator<<(pMVar11,(EndMessageToken *)&tcu::TestLog::EndMessage);
    tcu::MessageBuilder::~MessageBuilder((MessageBuilder *)&message.m_str.field_0x170);
    pTVar9 = deqp::Context::getTestContext((this->super_TestCase).m_context);
    pTVar10 = tcu::TestContext::getLog(pTVar9);
    tcu::TestLog::operator<<
              ((MessageBuilder *)local_3e0,pTVar10,(BeginMessageToken *)&tcu::TestLog::Message);
    tcu::MessageBuilder::operator<<((MessageBuilder *)local_3e0,(char (*) [9])"Results:");
    dVar12 = extraout_XMM0_Qa;
    for (local_3e4 = 0; local_3e4 < 5; local_3e4 = local_3e4 + 1) {
      dVar12 = Utils::vec4<float>::log((vec4<float> *)(local_d8 + (ulong)local_3e4 * 0x10),dVar12);
    }
    tcu::MessageBuilder::operator<<
              ((MessageBuilder *)local_3e0,(EndMessageToken *)&tcu::TestLog::EndMessage);
    pTVar9 = deqp::Context::getTestContext((this->super_TestCase).m_context);
    pTVar10 = tcu::TestContext::getLog(pTVar9);
    tcu::TestLog::operator<<
              ((MessageBuilder *)local_568,pTVar10,(BeginMessageToken *)&tcu::TestLog::Message);
    tcu::MessageBuilder::operator=((MessageBuilder *)local_3e0,(MessageBuilder *)local_568);
    tcu::MessageBuilder::~MessageBuilder((MessageBuilder *)local_568);
    tcu::MessageBuilder::operator<<((MessageBuilder *)local_3e0,(char (*) [10])"Expected:");
    dVar12 = extraout_XMM0_Qa_00;
    for (local_56c = 0; local_56c < 5; local_56c = local_56c + 1) {
      dVar12 = Utils::vec4<float>::log(expected_results + local_56c,dVar12);
    }
    tcu::MessageBuilder::operator<<
              ((MessageBuilder *)local_3e0,(EndMessageToken *)&tcu::TestLog::EndMessage);
    tcu::MessageBuilder::~MessageBuilder((MessageBuilder *)local_3e0);
  }
  return (bool)(subroutine_uniforms[0]._3_1_ & 1);
}

Assistant:

bool FunctionalTest3_4::testDraw(GLuint program_id, const GLchar* first_routine_name, const GLchar* second_routine_name,
								 const GLchar** uniform_names, const Utils::vec4<GLfloat> expected_results[5],
								 bool use_program_query) const
{
	static const GLuint   n_varyings			 = 5;
	const glw::Functions& gl					 = m_context.getRenderContext().getFunctions();
	bool				  result				 = true;
	GLuint				  subroutine_uniforms[2] = { 0 };

	/* Get subroutine uniform locations */
	GLint first_routine_location = getSubroutineUniformLocation(program_id, uniform_names[0], use_program_query);

	GLint second_routine_location = getSubroutineUniformLocation(program_id, uniform_names[1], use_program_query);

	/* Get subroutine indices */
	GLuint first_routine_index = getSubroutineIndex(program_id, first_routine_name, use_program_query);

	GLuint second_routine_index = getSubroutineIndex(program_id, second_routine_name, use_program_query);

	/* Map uniforms with subroutines */
	subroutine_uniforms[first_routine_location]  = first_routine_index;
	subroutine_uniforms[second_routine_location] = second_routine_index;

	gl.uniformSubroutinesuiv(GL_VERTEX_SHADER, 2 /* number of uniforms */, &subroutine_uniforms[0]);
	GLU_EXPECT_NO_ERROR(gl.getError(), "UniformSubroutinesuiv");

	/* Get location of input_data */
	GLint input_data_location = gl.getUniformLocation(program_id, "input_data");
	GLU_EXPECT_NO_ERROR(gl.getError(), "GetUniformLocation");

	if (-1 == input_data_location)
	{
		TCU_FAIL("Uniform is not available");
	}

	/* Set up input_data */
	gl.uniform4f(input_data_location, expected_results[0].m_x, expected_results[0].m_y, expected_results[0].m_z,
				 expected_results[0].m_w);
	GLU_EXPECT_NO_ERROR(gl.getError(), "Uniform4f");

	/* Execute draw call with transform feedback */
	gl.beginTransformFeedback(GL_POINTS);
	GLU_EXPECT_NO_ERROR(gl.getError(), "BeginTransformFeedback");

	gl.drawArrays(GL_POINTS, 0 /* first */, 1 /* count */);
	GLU_EXPECT_NO_ERROR(gl.getError(), "DrawArrays");

	gl.endTransformFeedback();
	GLU_EXPECT_NO_ERROR(gl.getError(), "EndTransformFeedback");

	/* Verify results */
	GLfloat* feedback_data = (GLfloat*)gl.mapBuffer(GL_TRANSFORM_FEEDBACK_BUFFER, GL_READ_ONLY);
	GLU_EXPECT_NO_ERROR(gl.getError(), "MapBuffer");

	Utils::vec4<GLfloat> results[5];

	results[0].m_x = feedback_data[0];
	results[0].m_y = feedback_data[1];
	results[0].m_z = feedback_data[2];
	results[0].m_w = feedback_data[3];

	results[1].m_x = feedback_data[4];
	results[1].m_y = feedback_data[5];
	results[1].m_z = feedback_data[6];
	results[1].m_w = feedback_data[7];

	results[2].m_x = feedback_data[8];
	results[2].m_y = feedback_data[9];
	results[2].m_z = feedback_data[10];
	results[2].m_w = feedback_data[11];

	results[3].m_x = feedback_data[12];
	results[3].m_y = feedback_data[13];
	results[3].m_z = feedback_data[14];
	results[3].m_w = feedback_data[15];

	results[4].m_x = feedback_data[16];
	results[4].m_y = feedback_data[17];
	results[4].m_z = feedback_data[18];
	results[4].m_w = feedback_data[19];

	gl.unmapBuffer(GL_TRANSFORM_FEEDBACK_BUFFER);
	GLU_EXPECT_NO_ERROR(gl.getError(), "UnmapBuffer");

	for (GLuint i = 0; i < n_varyings; ++i)
	{
		result = result && (results[i] == expected_results[i]);
	}

	if (false == result)
	{
		m_context.getTestContext().getLog() << tcu::TestLog::Message
											<< "Error. Invalid result. First routine: " << first_routine_name
											<< ". Second routine: " << second_routine_name << tcu::TestLog::EndMessage;

		tcu::MessageBuilder message = m_context.getTestContext().getLog() << tcu::TestLog::Message;

		message << "Results:";

		for (GLuint i = 0; i < n_varyings; ++i)
		{
			results[i].log(message);
		}

		message << tcu::TestLog::EndMessage;

		message = m_context.getTestContext().getLog() << tcu::TestLog::Message;

		message << "Expected:";

		for (GLuint i = 0; i < n_varyings; ++i)
		{
			expected_results[i].log(message);
		}

		message << tcu::TestLog::EndMessage;
	}

	return result;
}